

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QByteArray * __thiscall
QStringBuilder<QStringBuilder<const_char_(&)[14],_const_QByteArray_&>,_const_char_(&)[4]>::
convertTo<QByteArray>
          (QByteArray *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<const_char_(&)[14],_const_QByteArray_&>,_const_char_(&)[4]>
          *this)

{
  char cVar1;
  char *pcVar2;
  QByteArray *pQVar3;
  size_t __n;
  char *pcVar4;
  long size;
  char *pcVar5;
  long size_00;
  
  size = (((this->a).b)->d).size + 0x10;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,size,Uninitialized);
  pcVar2 = (__return_storage_ptr__->d).ptr;
  pcVar4 = *(this->a).a;
  cVar1 = *pcVar4;
  pcVar5 = pcVar2;
  while (cVar1 != '\0') {
    pcVar4 = pcVar4 + 1;
    *pcVar5 = cVar1;
    pcVar5 = pcVar5 + 1;
    cVar1 = *pcVar4;
  }
  pQVar3 = (this->a).b;
  __n = (pQVar3->d).size;
  if (__n != 0) {
    memcpy(pcVar5,(pQVar3->d).ptr,__n);
  }
  pcVar5 = pcVar5 + __n;
  pcVar4 = *this->b;
  cVar1 = *pcVar4;
  while (cVar1 != '\0') {
    pcVar4 = pcVar4 + 1;
    *pcVar5 = cVar1;
    pcVar5 = pcVar5 + 1;
    cVar1 = *pcVar4;
  }
  size_00 = (long)pcVar5 - (long)pcVar2;
  if (size != size_00) {
    QByteArray::resize(__return_storage_ptr__,size_00);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }